

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * CheckPlannerType_abi_cxx11_(int numOptions,char **argv)

{
  int iVar1;
  long in_RDX;
  int in_ESI;
  string *in_RDI;
  int i;
  int optionLength;
  string *s;
  allocator<char> local_35 [5];
  allocator<char> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 10;
  iVar3 = 1;
  while( true ) {
    if (in_ESI + 1 <= iVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,iVar3),
                 (char *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                 in_stack_ffffffffffffffd0);
      std::allocator<char>::~allocator(local_35);
      return in_RDI;
    }
    iVar1 = strncmp("--planner=",*(char **)(in_RDX + (long)iVar3 * 8),(long)iVar4);
    if (iVar1 == 0) break;
    iVar3 = iVar3 + 1;
  }
  uVar2 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar4,iVar3),(char *)CONCAT17(uVar2,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffde);
  return in_RDI;
}

Assistant:

std::string CheckPlannerType(int numOptions, char** argv)
{
    int optionLength = strlen("--planner=");
    for (int i = 1; i < numOptions + 1; i++) {
        if (strncmp("--planner=", argv[i], optionLength) == 0) {
            std::string s(&argv[i][optionLength]);
            return s;
        }
    }
    return std::string("arastar");
}